

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer.cpp
# Opt level: O3

void QtSharedPointer::internalSafetyCheckAdd(void *d_ptr,void *ptr)

{
  __pointer_type copy_00;
  byte bVar1;
  Data *this;
  Data *this_00;
  long lVar2;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *pQVar3;
  Type *this_01;
  Node<const_volatile_void_*,_const_void_*> *pNVar4;
  long lVar5;
  long lVar6;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *in_RSI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  void *copy;
  Data local_68;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *local_60;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *local_58;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *local_50;
  undefined1 local_48 [16];
  undefined4 local_38;
  undefined4 uStack_34;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = in_RSI;
  local_58 = in_RDI;
  this_01 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_>::
            operator()(in_RDI);
  if (this_01 == (Type *)0x0) goto LAB_00386f4e;
  if (in_RSI == (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_>
                 *)0x0) {
    local_60 = in_RDI;
  }
  if ((this_01->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar7 = (this_01->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar7) {
      (this_01->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar7) goto LAB_00386e6a;
  }
  else {
LAB_00386e6a:
    QBasicMutex::lockInternal((QBasicMutex *)this_01);
  }
  this = (this_01->dataPointers).d;
  if (((this != (Data *)0x0) &&
      (pNVar4 = QHashPrivate::Data<QHashPrivate::Node<void_const_volatile*,void_const*>>::
                findNode<void_const_volatile*>
                          ((Data<QHashPrivate::Node<void_const_volatile*,void_const*>> *)this,
                           &local_60), pNVar4 != (Node<const_volatile_void_*,_const_void_*> *)0x0))
     && (pNVar4->value != (void *)0x0)) {
    local_48._0_4_ = 2;
    local_48._4_4_ = 0;
    local_48._8_4_ = 0;
    local_48._12_4_ = 0;
    local_38._0_1_ = false;
    local_38._1_3_ = 0;
    uStack_34 = 0;
    local_30 = "default";
    QMessageLogger::fatal
              ((QMessageLogger *)local_48,
               "QSharedPointer: internal self-check failed: pointer %p was already tracked by another QSharedPointer object %p"
               ,local_60);
  }
  pQVar3 = local_60;
  local_68.pointer = local_60;
  local_50 = local_58;
  this_00 = (this_01->dPointers).d;
  if (this_00 == (Data *)0x0) {
    local_48._0_4_ = 0;
    local_48._4_4_ = 0;
LAB_00386ef7:
    QHash<const_void_*,_(anonymous_namespace)::Data>::detach(&this_01->dPointers);
    QHash<void_const*,(anonymous_namespace)::Data>::
    emplace_helper<(anonymous_namespace)::Data_const&>
              ((QHash<void_const*,(anonymous_namespace)::Data> *)(this_01->dPointers).d,&local_50,
               &local_68);
    QHash<const_void_*,_(anonymous_namespace)::Data>::~QHash
              ((QHash<const_void_*,_(anonymous_namespace)::Data> *)local_48);
  }
  else {
    if (1 < (uint)(this_00->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_48._0_4_ = SUB84(this_00,0);
      local_48._4_4_ = (undefined4)((ulong)this_00 >> 0x20);
      if ((this_00->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (this_00->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (this_00->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00386ef7;
    }
    if (this_00->size < this_00->numBuckets >> 1) {
      QHash<void_const*,(anonymous_namespace)::Data>::
      emplace_helper<(anonymous_namespace)::Data_const&>
                ((QHash<void_const*,(anonymous_namespace)::Data> *)this_00,&local_50,&local_68);
    }
    else {
      local_38._0_1_ = true;
      local_38._1_3_ = 0xaaaaaa;
      uStack_34 = 0xaaaaaaaa;
      local_48._0_4_ = -0x55555556;
      local_48._4_4_ = -0x55555556;
      local_48._8_4_ = 0xaaaaaaaa;
      local_48._12_4_ = 0xaaaaaaaa;
      QHashPrivate::Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>>::
      findOrInsert<void_const*>
                ((InsertionResult *)local_48,
                 (Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *)this_00,
                 &local_50);
      lVar5 = *(long *)(CONCAT44(local_48._4_4_,local_48._0_4_) + 0x20);
      lVar6 = (CONCAT44(local_48._12_4_,local_48._8_4_) >> 7) * 0x90;
      lVar2 = *(long *)(lVar5 + 0x80 + lVar6);
      bVar1 = *(byte *)((ulong)(local_48._8_4_ & 0x7f) + lVar5 + lVar6);
      if (local_38._0_1_ == false) {
        lVar5 = (ulong)bVar1 * 0x10;
        *(QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> **)
         (lVar2 + lVar5) = local_58;
      }
      else {
        lVar5 = (ulong)bVar1 << 4;
      }
      *(QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> **)
       (lVar2 + 8 + lVar5) = pQVar3;
    }
  }
  local_48._0_4_ = SUB84(local_60,0);
  local_48._4_4_ = (undefined4)((ulong)local_60 >> 0x20);
  QHash<void_const_volatile*,void_const*>::emplace<void_const*const&>
            ((QHash<void_const_volatile*,void_const*> *)&this_01->dataPointers,(void **)local_48,
             &local_58);
  LOCK();
  copy_00 = (this_01->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this_01->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy_00 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_01,copy_00);
  }
LAB_00386f4e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QtSharedPointer::internalSafetyCheckAdd(const void *d_ptr, const volatile void *ptr)
{
    KnownPointers *const kp = knownPointers();
    if (!kp)
        return;                 // end-game: the application is being destroyed already

    if (!ptr) {
        // nullptr is allowed to be tracked by more than one QSharedPointer, so we
        // need something else to put in our tracking structures
        ptr = d_ptr;
    }

    QMutexLocker lock(&kp->mutex);
    Q_ASSERT(!kp->dPointers.contains(d_ptr));

    //qDebug("Adding d=%p value=%p", d_ptr, ptr);

    const void *other_d_ptr = kp->dataPointers.value(ptr, nullptr);
    if (Q_UNLIKELY(other_d_ptr)) {
#  ifdef BACKTRACE_SUPPORTED
        printBacktrace(knownPointers()->dPointers.value(other_d_ptr).backtrace);
#  endif
        qFatal("QSharedPointer: internal self-check failed: pointer %p was already tracked "
               "by another QSharedPointer object %p", ptr, other_d_ptr);
    }

    Data data;
    data.pointer = ptr;
#  ifdef BACKTRACE_SUPPORTED
    data.backtrace = saveBacktrace();
#  endif

    kp->dPointers.insert(d_ptr, data);
    kp->dataPointers.insert(ptr, d_ptr);
    Q_ASSERT(kp->dPointers.size() == kp->dataPointers.size());
}